

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

void __thiscall google::protobuf::DescriptorPool::Tables::Tables(Tables *this)

{
  _Rb_tree_header *p_Var1;
  long lVar2;
  __hashtable *__h;
  __node_gen_type __node_gen;
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,google::protobuf::Descriptor::WellKnownType>,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::Descriptor::WellKnownType>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  *local_2b8;
  undefined1 *local_2b0 [2];
  undefined1 local_2a0 [16];
  undefined4 local_290;
  undefined1 *local_288 [2];
  undefined1 local_278 [16];
  undefined4 local_268;
  undefined1 *local_260 [2];
  undefined1 local_250 [16];
  undefined4 local_240;
  undefined1 *local_238 [2];
  undefined1 local_228 [16];
  undefined4 local_218;
  undefined1 *local_210 [2];
  undefined1 local_200 [16];
  undefined4 local_1f0;
  undefined1 *local_1e8 [2];
  undefined1 local_1d8 [16];
  undefined4 local_1c8;
  undefined1 *local_1c0 [2];
  undefined1 local_1b0 [16];
  undefined4 local_1a0;
  undefined1 *local_198 [2];
  undefined1 local_188 [16];
  undefined4 local_178;
  undefined1 *local_170 [2];
  undefined1 local_160 [16];
  undefined4 local_150;
  undefined1 *local_148 [2];
  undefined1 local_138 [16];
  undefined4 local_128;
  undefined1 *local_120 [2];
  undefined1 local_110 [16];
  undefined4 local_100;
  undefined1 *local_f8 [2];
  undefined1 local_e8 [16];
  undefined4 local_d8;
  undefined1 *local_d0 [2];
  undefined1 local_c0 [16];
  undefined4 local_b0;
  undefined1 *local_a8 [2];
  undefined1 local_98 [16];
  undefined4 local_88;
  undefined1 *local_80 [2];
  undefined1 local_70 [16];
  undefined4 local_60;
  undefined1 *local_58 [2];
  undefined1 local_48 [16];
  undefined4 local_38;
  
  (this->pending_files_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->pending_files_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->pending_files_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->known_bad_files_)._M_h._M_buckets = &(this->known_bad_files_)._M_h._M_single_bucket;
  (this->known_bad_files_)._M_h._M_bucket_count = 1;
  (this->known_bad_files_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->known_bad_files_)._M_h._M_element_count = 0;
  (this->known_bad_files_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->known_bad_files_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->known_bad_files_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->known_bad_symbols_)._M_h._M_buckets = &(this->known_bad_symbols_)._M_h._M_single_bucket;
  (this->known_bad_symbols_)._M_h._M_bucket_count = 1;
  (this->known_bad_symbols_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->known_bad_symbols_)._M_h._M_element_count = 0;
  (this->known_bad_symbols_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->known_bad_symbols_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->known_bad_symbols_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->extensions_loaded_from_db_)._M_h._M_buckets =
       &(this->extensions_loaded_from_db_)._M_h._M_single_bucket;
  (this->extensions_loaded_from_db_)._M_h._M_bucket_count = 1;
  (this->extensions_loaded_from_db_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->extensions_loaded_from_db_)._M_h._M_element_count = 0;
  (this->extensions_loaded_from_db_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->extensions_loaded_from_db_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->extensions_loaded_from_db_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->well_known_types_)._M_h._M_buckets = &(this->well_known_types_)._M_h._M_single_bucket;
  (this->well_known_types_)._M_h._M_bucket_count = 1;
  (this->well_known_types_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->well_known_types_)._M_h._M_element_count = 0;
  (this->well_known_types_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->arena_).rollback_info_.
  super__Vector_base<google::protobuf::(anonymous_namespace)::TableArena::RollbackInfo,_std::allocator<google::protobuf::(anonymous_namespace)::TableArena::RollbackInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->arena_).rollback_info_.
  super__Vector_base<google::protobuf::(anonymous_namespace)::TableArena::RollbackInfo,_std::allocator<google::protobuf::(anonymous_namespace)::TableArena::RollbackInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->arena_).num_allocations_ = 0;
  (this->arena_).rollback_info_.
  super__Vector_base<google::protobuf::(anonymous_namespace)::TableArena::RollbackInfo,_std::allocator<google::protobuf::(anonymous_namespace)::TableArena::RollbackInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->arena_).small_size_blocks_._M_elems[5] = (Block *)0x0;
  (this->arena_).full_blocks_ = (Block *)0x0;
  (this->arena_).small_size_blocks_._M_elems[3] = (Block *)0x0;
  (this->arena_).small_size_blocks_._M_elems[4] = (Block *)0x0;
  (this->arena_).small_size_blocks_._M_elems[1] = (Block *)0x0;
  (this->arena_).small_size_blocks_._M_elems[2] = (Block *)0x0;
  (this->arena_).current_ = (Block *)0x0;
  (this->arena_).small_size_blocks_._M_elems[0] = (Block *)0x0;
  (this->well_known_types_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->well_known_types_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->symbols_by_name_)._M_h._M_buckets = &(this->symbols_by_name_)._M_h._M_single_bucket;
  (this->symbols_by_name_)._M_h._M_bucket_count = 1;
  (this->symbols_by_name_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->symbols_by_name_)._M_h._M_element_count = 0;
  (this->symbols_by_name_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->symbols_by_name_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->symbols_by_name_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->files_by_name_)._M_h._M_buckets = &(this->files_by_name_)._M_h._M_single_bucket;
  (this->files_by_name_)._M_h._M_bucket_count = 1;
  (this->files_by_name_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->files_by_name_)._M_h._M_element_count = 0;
  (this->files_by_name_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->files_by_name_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->files_by_name_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  p_Var1 = &(this->extensions_)._M_t._M_impl.super__Rb_tree_header;
  (this->extensions_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->extensions_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->extensions_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->extensions_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->extensions_after_checkpoint_).
  super__Vector_base<std::pair<const_google::protobuf::Descriptor_*,_int>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->extensions_after_checkpoint_).
  super__Vector_base<std::pair<const_google::protobuf::Descriptor_*,_int>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->extensions_after_checkpoint_).
  super__Vector_base<std::pair<const_google::protobuf::Descriptor_*,_int>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->files_after_checkpoint_).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->files_after_checkpoint_).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->symbols_after_checkpoint_).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->files_after_checkpoint_).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->symbols_after_checkpoint_).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->symbols_after_checkpoint_).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->checkpoints_).
  super__Vector_base<google::protobuf::DescriptorPool::Tables::CheckPoint,_std::allocator<google::protobuf::DescriptorPool::Tables::CheckPoint>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->checkpoints_).
  super__Vector_base<google::protobuf::DescriptorPool::Tables::CheckPoint,_std::allocator<google::protobuf::DescriptorPool::Tables::CheckPoint>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->extensions_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->checkpoints_).
  super__Vector_base<google::protobuf::DescriptorPool::Tables::CheckPoint,_std::allocator<google::protobuf::DescriptorPool::Tables::CheckPoint>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2b0[0] = local_2a0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2b0,"google.protobuf.DoubleValue","");
  local_290 = 1;
  local_288[0] = local_278;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_288,"google.protobuf.FloatValue","");
  local_268 = 2;
  local_260[0] = local_250;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_260,"google.protobuf.Int64Value","");
  local_240 = 3;
  local_238[0] = local_228;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_238,"google.protobuf.UInt64Value","");
  local_218 = 4;
  local_210[0] = local_200;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_210,"google.protobuf.Int32Value","");
  local_1f0 = 5;
  local_1e8[0] = local_1d8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1e8,"google.protobuf.UInt32Value","");
  local_1c8 = 6;
  local_1c0[0] = local_1b0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1c0,"google.protobuf.StringValue","");
  local_1a0 = 7;
  local_198[0] = local_188;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_198,"google.protobuf.BytesValue","");
  local_178 = 8;
  local_170[0] = local_160;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_170,"google.protobuf.BoolValue","");
  local_150 = 9;
  local_148[0] = local_138;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_148,"google.protobuf.Any","");
  local_128 = 10;
  local_120[0] = local_110;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_120,"google.protobuf.FieldMask","");
  local_100 = 0xb;
  local_f8[0] = local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,"google.protobuf.Duration","");
  local_d8 = 0xc;
  local_d0[0] = local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"google.protobuf.Timestamp","")
  ;
  local_b0 = 0xd;
  local_a8[0] = local_98;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"google.protobuf.Value","");
  local_88 = 0xe;
  local_80[0] = local_70;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"google.protobuf.ListValue","")
  ;
  local_60 = 0xf;
  local_58[0] = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"google.protobuf.Struct","");
  local_38 = 0x10;
  lVar2 = 0;
  local_2b8 = (_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,google::protobuf::Descriptor::WellKnownType>,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::Descriptor::WellKnownType>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
               *)&this->well_known_types_;
  do {
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,google::protobuf::Descriptor::WellKnownType>,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::Descriptor::WellKnownType>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::
    _M_insert<std::pair<std::__cxx11::string_const,google::protobuf::Descriptor::WellKnownType>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<std::__cxx11::string_const,google::protobuf::Descriptor::WellKnownType>,true>>>>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,google::protobuf::Descriptor::WellKnownType>,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::Descriptor::WellKnownType>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)&this->well_known_types_,(long)local_2b0 + lVar2,&local_2b8);
    lVar2 = lVar2 + 0x28;
  } while (lVar2 != 0x280);
  lVar2 = 0;
  do {
    if (local_48 + lVar2 != *(undefined1 **)((long)local_58 + lVar2)) {
      operator_delete(*(undefined1 **)((long)local_58 + lVar2));
    }
    lVar2 = lVar2 + -0x28;
  } while (lVar2 != -0x280);
  return;
}

Assistant:

DescriptorPool::Tables::Tables() {
  well_known_types_.insert({
      {"google.protobuf.DoubleValue", Descriptor::WELLKNOWNTYPE_DOUBLEVALUE},
      {"google.protobuf.FloatValue", Descriptor::WELLKNOWNTYPE_FLOATVALUE},
      {"google.protobuf.Int64Value", Descriptor::WELLKNOWNTYPE_INT64VALUE},
      {"google.protobuf.UInt64Value", Descriptor::WELLKNOWNTYPE_UINT64VALUE},
      {"google.protobuf.Int32Value", Descriptor::WELLKNOWNTYPE_INT32VALUE},
      {"google.protobuf.UInt32Value", Descriptor::WELLKNOWNTYPE_UINT32VALUE},
      {"google.protobuf.StringValue", Descriptor::WELLKNOWNTYPE_STRINGVALUE},
      {"google.protobuf.BytesValue", Descriptor::WELLKNOWNTYPE_BYTESVALUE},
      {"google.protobuf.BoolValue", Descriptor::WELLKNOWNTYPE_BOOLVALUE},
      {"google.protobuf.Any", Descriptor::WELLKNOWNTYPE_ANY},
      {"google.protobuf.FieldMask", Descriptor::WELLKNOWNTYPE_FIELDMASK},
      {"google.protobuf.Duration", Descriptor::WELLKNOWNTYPE_DURATION},
      {"google.protobuf.Timestamp", Descriptor::WELLKNOWNTYPE_TIMESTAMP},
      {"google.protobuf.Value", Descriptor::WELLKNOWNTYPE_VALUE},
      {"google.protobuf.ListValue", Descriptor::WELLKNOWNTYPE_LISTVALUE},
      {"google.protobuf.Struct", Descriptor::WELLKNOWNTYPE_STRUCT},
  });
}